

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIndex.h
# Opt level: O0

void __thiscall
adios2::query::BlockIndex<long_double>::RunStatMinBlocksInfo
          (BlockIndex<long_double> *this,QueryVar *query,MinVarInfo *MinBlocksInfo,
          vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *hitBlocks)

{
  bool bVar1;
  Dims *count;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *ppVar2;
  reference pvVar3;
  value_type *in_RCX;
  long in_RDX;
  QueryVar *in_RDI;
  Box<adios2::Dims> box;
  size_type i;
  Dims cc;
  Dims ss;
  bool isHit;
  longdouble bmax;
  longdouble bmin;
  MinBlockInfo *blockInfo;
  const_iterator __end3;
  const_iterator __begin3;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *__range3;
  value_type *in_stack_fffffffffffffe68;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffe70;
  Box<Dims> *in_stack_fffffffffffffe80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe88;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffe90;
  Dims *start;
  longdouble *in_stack_fffffffffffffee8;
  longdouble *in_stack_fffffffffffffef0;
  RangeTree *in_stack_fffffffffffffef8;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  undefined1 local_89 [32];
  byte local_69;
  longdouble local_68;
  longdouble local_58;
  reference local_40;
  MinBlockInfo *local_38;
  __normal_iterator<const_adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
  local_30;
  long local_28;
  value_type *local_20;
  long local_18;
  
  local_28 = in_RDX + 0x20;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_30._M_current =
       (MinBlockInfo *)
       std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::begin
                 ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                  in_stack_fffffffffffffe68);
  local_38 = (MinBlockInfo *)
             std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::end
                       ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                        in_stack_fffffffffffffe68);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
                             *)in_stack_fffffffffffffe70,
                            (__normal_iterator<const_adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
                             *)in_stack_fffffffffffffe68), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
               ::operator*(&local_30);
    local_58 = (local_40->MinMax).MinUnion.field_ldouble;
    local_68 = (local_40->MinMax).MaxUnion.field_ldouble;
    local_69 = RangeTree::CheckInterval<long_double>
                         (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                          in_stack_fffffffffffffee8);
    if ((bool)local_69) {
      if (*(int *)((in_RDI->super_QueryBase)._vptr_QueryBase + 8) == 5) {
        in_stack_fffffffffffffe70 =
             (pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)&stack0xfffffffffffffec0;
        in_stack_fffffffffffffe68 = local_20;
        BlockHit::BlockHit((BlockHit *)in_stack_fffffffffffffe70,(size_t)local_20);
        std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::push_back
                  ((vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
                   in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        BlockHit::~BlockHit((BlockHit *)0xd3c7ba);
      }
      else {
        count = (Dims *)(long)*(int *)(local_18 + 0xc);
        start = (Dims *)local_89;
        std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xd3c497);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&in_stack_fffffffffffffe90->first,(size_type)in_stack_fffffffffffffe88,
                   (allocator_type *)in_stack_fffffffffffffe80);
        std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xd3c4bd);
        std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xd3c4e0);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&in_stack_fffffffffffffe90->first,(size_type)in_stack_fffffffffffffe88,
                   (allocator_type *)in_stack_fffffffffffffe80);
        std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xd3c506);
        local_c8 = (pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)0x0;
        while (in_stack_fffffffffffffe90 = local_c8,
              ppVar2 = (pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     (local_89 + 1)), in_stack_fffffffffffffe90 < ppVar2) {
          in_stack_fffffffffffffe80 = (Box<Dims> *)local_40->Start[(long)local_c8];
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (local_89 + 1),(size_type)local_c8);
          *pvVar3 = (value_type)in_stack_fffffffffffffe80;
          in_stack_fffffffffffffe88 =
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               local_40->Count[(long)local_c8];
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_b8,(size_type)local_c8);
          *pvVar3 = (value_type)in_stack_fffffffffffffe88;
          local_c8 = (pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)((long)&(local_c8->first).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + 1);
        }
        bVar1 = QueryVar::TouchSelection(in_RDI,start,count);
        if ((bVar1) && ((local_69 & 1) != 0)) {
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                    (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                     &in_stack_fffffffffffffe80->first);
          BlockHit::BlockHit((BlockHit *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88
                             ,in_stack_fffffffffffffe80);
          std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::push_back
                    ((vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
                     in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          BlockHit::~BlockHit((BlockHit *)0xd3c6bc);
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::~pair(in_stack_fffffffffffffe70);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  (&in_stack_fffffffffffffe80->first);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  (&in_stack_fffffffffffffe80->first);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void RunStatMinBlocksInfo(const QueryVar &query, const adios2::MinVarInfo *MinBlocksInfo,
                              std::vector<BlockHit> &hitBlocks)
    {
        for (auto &blockInfo : MinBlocksInfo->BlocksInfo)
        {
            T bmin = *(T *)&blockInfo.MinMax.MinUnion;
            T bmax = *(T *)&blockInfo.MinMax.MaxUnion;
            bool isHit = query.m_RangeTree.CheckInterval(bmin, bmax);

            if (!isHit)
                continue;

            if (m_VarPtr->m_ShapeID != adios2::ShapeID::LocalArray)
            {
                Dims ss(MinBlocksInfo->Dims);
                Dims cc(MinBlocksInfo->Dims);
                for (std::vector<int>::size_type i = 0; i < ss.size(); i++)
                {
                    ss[i] = blockInfo.Start[i];
                    cc[i] = blockInfo.Count[i];
                }
                if (!query.TouchSelection(ss, cc))
                    continue;

                if (isHit)
                {
                    adios2::Box<adios2::Dims> box = {ss, cc};
                    hitBlocks.push_back(BlockHit(blockInfo.BlockID, box));
                }
            }
            else
            { // local array
                hitBlocks.push_back(BlockHit(blockInfo.BlockID));
            }
        }
    }